

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise3d.cpp
# Opt level: O1

int __thiscall
ncnn::ConvolutionDepthWise3D::forward
          (ConvolutionDepthWise3D *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  size_t sVar6;
  float *pfVar7;
  void *pvVar8;
  int *piVar9;
  Mat *pMVar10;
  int iVar11;
  pointer piVar12;
  uint uVar13;
  uint _h;
  int iVar14;
  ulong uVar15;
  long lVar16;
  int iVar17;
  ulong uVar18;
  ulong uVar19;
  uint _w;
  ulong uVar20;
  int iVar21;
  int l;
  int iVar22;
  ulong uVar23;
  long lVar24;
  int iVar25;
  void *pvVar26;
  size_type __n;
  int iVar27;
  void *pvVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  Mat bottom_blob_bordered;
  vector<int,_std::allocator<int>_> _space_ofs;
  Option opt_pad;
  void *local_208;
  allocator_type local_1f1;
  float *local_1f0;
  ulong local_1e8;
  ulong local_1e0;
  void *local_1d8;
  ulong local_1d0;
  float *local_1c8;
  ulong local_1c0;
  size_t local_1b8;
  ulong local_1b0;
  ConvolutionDepthWise3D *local_1a8;
  ulong local_1a0;
  ulong local_198;
  ulong local_190;
  long local_188;
  void *local_180;
  long local_178;
  void *local_170;
  void *local_168;
  void *local_160;
  ulong local_158;
  long local_150;
  ulong local_148;
  int local_140;
  uint local_13c;
  undefined1 local_138 [16];
  Mat *local_120;
  ulong local_118;
  ulong local_110;
  Mat local_108;
  undefined1 local_b8 [16];
  long local_a8;
  void *local_a0;
  long local_98;
  vector<int,_std::allocator<int>_> local_90;
  Option local_78;
  
  iVar14 = bottom_blob->c;
  sVar6 = bottom_blob->elemsize;
  iVar27 = this->kernel_w;
  iVar2 = this->kernel_h;
  iVar3 = this->dilation_w;
  iVar4 = this->dilation_h;
  iVar5 = this->kernel_d;
  iVar17 = this->dilation_d;
  local_108.cstep = 0;
  local_108.data = (void *)0x0;
  local_108.refcount._0_4_ = 0;
  local_108.refcount._4_4_ = 0;
  local_108.elemsize._0_4_ = 0;
  local_108.elemsize._4_4_ = 0;
  local_108.elempack = 0;
  local_108.allocator = (Allocator *)0x0;
  local_108.dims = 0;
  local_108.w = 0;
  local_108.h = 0;
  local_108.d = 0;
  local_108.c = 0;
  local_78.lightmode = opt->lightmode;
  local_78._1_3_ = *(undefined3 *)&opt->field_0x1;
  local_78.num_threads = opt->num_threads;
  local_78.blob_allocator = opt->blob_allocator;
  local_78.workspace_allocator = opt->workspace_allocator;
  local_78.openmp_blocktime = opt->openmp_blocktime;
  local_78.use_winograd_convolution = opt->use_winograd_convolution;
  local_78.use_sgemm_convolution = opt->use_sgemm_convolution;
  local_78.use_int8_inference = opt->use_int8_inference;
  local_78.use_vulkan_compute = opt->use_vulkan_compute;
  uVar20._0_1_ = opt->use_bf16_storage;
  uVar20._1_1_ = opt->use_fp16_packed;
  uVar20._2_1_ = opt->use_fp16_storage;
  uVar20._3_1_ = opt->use_fp16_arithmetic;
  uVar20._4_1_ = opt->use_int8_packed;
  uVar20._5_1_ = opt->use_int8_storage;
  uVar20._6_1_ = opt->use_int8_arithmetic;
  uVar20._7_1_ = opt->use_packing_layout;
  local_78.use_shader_pack8 = opt->use_shader_pack8;
  local_78.use_subgroup_basic = opt->use_subgroup_basic;
  local_78.use_subgroup_vote = opt->use_subgroup_vote;
  local_78.use_subgroup_ballot = opt->use_subgroup_ballot;
  local_78.use_subgroup_shuffle = opt->use_subgroup_shuffle;
  local_78.use_image_storage = opt->use_image_storage;
  local_78.use_tensor_storage = opt->use_tensor_storage;
  local_78.use_weight_fp16_storage = opt->use_weight_fp16_storage;
  local_78.flush_denormals = opt->flush_denormals;
  local_78.use_local_pool_allocator = opt->use_local_pool_allocator;
  local_78.use_reserved_1 = opt->use_reserved_1;
  local_78.use_reserved_2 = opt->use_reserved_2;
  local_78.use_reserved_3 = opt->use_reserved_3;
  local_78.use_reserved_4 = opt->use_reserved_4;
  local_78.use_reserved_5 = opt->use_reserved_5;
  local_78.use_reserved_6 = opt->use_reserved_6;
  local_78.use_reserved_7 = opt->use_reserved_7;
  local_78.use_reserved_8 = opt->use_reserved_8;
  local_78.use_reserved_9 = opt->use_reserved_9;
  local_78.use_reserved_10 = opt->use_reserved_10;
  local_78.use_reserved_11 = opt->use_reserved_11;
  local_78._32_8_ = uVar20 & 0xffffffffffffff;
  local_120 = top_blob;
  make_padding(this,bottom_blob,&local_108,&local_78);
  iVar11 = local_108.h;
  iVar21 = -100;
  if ((local_108.data != (void *)0x0) && ((long)local_108.c * local_108.cstep != 0)) {
    local_1c0 = CONCAT44(local_1c0._4_4_,local_108.w);
    uVar20 = (long)(~((iVar27 + -1) * iVar3) + local_108.w) / (long)this->stride_w;
    uVar19 = (long)(~((iVar2 + -1) * iVar4) + local_108.h) / (long)this->stride_h;
    uVar15 = uVar19 & 0xffffffff;
    uVar23 = (long)(~((iVar5 + -1) * iVar17) + local_108.d) / (long)this->stride_d;
    uVar13 = this->kernel_w * this->kernel_h * this->kernel_d;
    __n = (size_type)(int)uVar13;
    local_1b8 = sVar6;
    std::vector<int,_std::allocator<int>_>::vector(&local_90,__n,&local_1f1);
    piVar12 = local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start;
    pMVar10 = local_120;
    _w = (int)uVar20 + 1;
    _h = (int)uVar19 + 1;
    local_1f0 = (float *)(ulong)_h;
    if (0 < this->kernel_d) {
      iVar27 = this->dilation_w;
      iVar2 = this->dilation_h;
      iVar3 = this->kernel_w;
      iVar4 = this->kernel_h;
      iVar5 = this->dilation_d;
      iVar17 = 0;
      iVar25 = 0;
      iVar21 = 0;
      do {
        if (0 < this->kernel_h) {
          iVar22 = 0;
          do {
            if (0 < this->kernel_w) {
              lVar24 = 0;
              do {
                local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[iVar17 + lVar24] = iVar25;
                iVar25 = iVar25 + this->dilation_w;
                lVar24 = lVar24 + 1;
              } while ((int)lVar24 < this->kernel_w);
              iVar17 = iVar17 + (int)lVar24;
            }
            iVar25 = iVar25 + (iVar2 * (int)local_1c0 - iVar27 * iVar3);
            iVar22 = iVar22 + 1;
          } while (iVar22 < this->kernel_h);
        }
        iVar25 = iVar25 + (iVar11 * iVar5 - iVar2 * iVar4) * (int)local_1c0;
        iVar21 = iVar21 + 1;
      } while (iVar21 < this->kernel_d);
    }
    local_1b0 = uVar23 & 0xffffffff;
    local_110 = uVar20 & 0xffffffff;
    Mat::create(local_120,_w,_h,(int)uVar23 + 1,this->num_output,local_1b8,opt->blob_allocator);
    iVar21 = -100;
    if ((pMVar10->data != (void *)0x0) && ((long)pMVar10->c * pMVar10->cstep != 0)) {
      iVar27 = this->group;
      local_1a8 = this;
      local_118 = uVar15;
      if (iVar27 == this->num_output && iVar14 == iVar27) {
        local_158 = (ulong)this->group;
        if (0 < (long)local_158) {
          local_160 = pMVar10->data;
          pvVar28 = (this->weight_data).data;
          local_170 = local_108.data;
          local_1e8 = local_108.cstep *
                      CONCAT44(local_108.elemsize._4_4_,(undefined4)local_108.elemsize);
          local_168 = (void *)(pMVar10->cstep * pMVar10->elemsize);
          local_1a0 = (ulong)(int)_w;
          local_1e0 = (long)local_108.w *
                      CONCAT44(local_108.elemsize._4_4_,(undefined4)local_108.elemsize);
          local_150 = (long)local_108.h * local_1e0;
          uVar20 = (ulong)_w;
          uVar23 = 0;
          uVar19 = local_1b0;
          local_198 = uVar20;
          do {
            if (-1 < (int)uVar19) {
              local_1d8 = (void *)(local_1e8 * uVar23 + (long)local_170);
              pvVar26 = (void *)((long)local_168 * uVar23 + (long)local_160);
              uVar18 = 0;
              local_190 = uVar23;
              do {
                local_148 = uVar18;
                if (-1 < (int)uVar15) {
                  iVar14 = local_1a8->bias_term;
                  iVar27 = local_1a8->activation_type;
                  local_b8._0_8_ =
                       (void *)((long)(int)uVar18 * (long)local_1a8->stride_d * local_150 +
                               (long)local_1d8);
                  local_1c0 = (ulong)local_1a8->stride_w;
                  local_1d0 = (long)local_1a8->stride_h * local_1e0;
                  local_1c8 = (float *)0x0;
                  local_188 = CONCAT44(local_188._4_4_,iVar14);
                  do {
                    if (-1 < (int)local_110) {
                      pfVar7 = (float *)(local_1a8->activation_params).data;
                      pvVar8 = (local_1a8->bias_data).data;
                      local_1b8 = (long)local_1c8 * local_1d0 + local_b8._0_8_;
                      uVar19 = 0;
                      local_180 = pvVar26;
                      do {
                        if (iVar14 == 0) {
                          fVar30 = 0.0;
                        }
                        else {
                          fVar30 = *(float *)((long)pvVar8 + uVar23 * 4);
                        }
                        if (0 < (int)uVar13) {
                          uVar15 = 0;
                          do {
                            fVar30 = fVar30 + *(float *)((long)pvVar28 + uVar15 * 4) *
                                              *(float *)(local_1b8 + uVar19 * local_1c0 * 4 +
                                                        (long)piVar12[uVar15] * 4);
                            uVar15 = uVar15 + 1;
                          } while (uVar13 != uVar15);
                        }
                        fVar31 = fVar30;
                        switch(iVar27) {
                        case 1:
                          if (fVar30 <= 0.0) {
                            fVar31 = 0.0;
                          }
                          break;
                        case 2:
                          fVar31 = (float)(~-(uint)(0.0 < fVar30) & (uint)*pfVar7 |
                                          -(uint)(0.0 < fVar30) & 0x3f800000) * fVar30;
                          break;
                        case 3:
                          if (fVar30 <= *pfVar7) {
                            fVar30 = *pfVar7;
                          }
                          fVar31 = fVar30;
                          if (pfVar7[1] <= fVar30) {
                            fVar31 = pfVar7[1];
                          }
                          break;
                        case 4:
                          fVar30 = expf(-fVar30);
                          uVar20 = local_198;
                          uVar23 = local_190;
                          pvVar26 = local_180;
                          iVar14 = (int)local_188;
                          fVar31 = 1.0 / (fVar30 + 1.0);
                          break;
                        case 5:
                          local_138 = ZEXT416((uint)fVar30);
                          fVar30 = expf(fVar30);
                          fVar30 = logf(fVar30 + 1.0);
                          fVar30 = tanhf(fVar30);
                          uVar20 = local_198;
                          uVar23 = local_190;
                          pvVar26 = local_180;
                          iVar14 = (int)local_188;
                          fVar31 = fVar30 * (float)local_138._0_4_;
                          break;
                        case 6:
                          fVar1 = *pfVar7;
                          fVar29 = -pfVar7[1] / fVar1;
                          fVar31 = 0.0;
                          if ((fVar29 <= fVar30) &&
                             (fVar31 = fVar30, fVar30 <= fVar29 + 1.0 / fVar1)) {
                            fVar31 = (fVar1 * fVar30 + pfVar7[1]) * fVar30;
                          }
                        }
                        *(float *)((long)pvVar26 + uVar19 * 4) = fVar31;
                        uVar19 = uVar19 + 1;
                      } while (uVar19 != uVar20);
                    }
                    pvVar26 = (void *)((long)pvVar26 + local_1a0 * 4);
                    local_1c8 = (float *)((long)local_1c8 + 1);
                  } while (local_1c8 != local_1f0);
                }
                uVar18 = (ulong)((int)local_148 + 1);
                uVar19 = local_1b0;
                uVar15 = local_118;
              } while ((int)local_148 != (int)local_1b0);
            }
            uVar23 = uVar23 + 1;
            pvVar28 = (void *)((long)pvVar28 + __n * 4);
          } while (uVar23 != local_158);
        }
      }
      else {
        uVar20 = (long)iVar14 / (long)iVar27;
        uVar18 = uVar20 & 0xffffffff;
        uVar19 = (long)this->num_output / (long)iVar27;
        uVar23 = uVar19 & 0xffffffff;
        local_98 = (long)this->group;
        if (0 < local_98) {
          local_a0 = (this->weight_data).data;
          iVar14 = (int)uVar20 * uVar13;
          local_148 = (ulong)(int)_w;
          local_13c = (uint)uVar19;
          local_a8 = (long)(int)local_13c;
          local_158 = uVar19 & 0xffffffff;
          local_140 = iVar14 * local_13c;
          local_150 = (long)iVar14 << 2;
          local_1e8 = 0;
          local_178 = 0;
          local_1a0 = CONCAT44(local_1a0._4_4_,(int)uVar20);
          do {
            if (0 < (int)uVar23) {
              local_138._0_8_ = (void *)((long)local_a0 + (long)(int)local_1e8 * 4);
              local_160 = (void *)(local_178 * local_a8);
              local_168 = local_120->data;
              iVar27 = (int)uVar18;
              iVar14 = (int)local_178;
              local_170 = (void *)(local_120->cstep * local_120->elemsize);
              local_1e0 = 0;
              do {
                if (-1 < (int)local_1b0) {
                  local_1c8 = (float *)(local_1e0 + (long)local_160);
                  local_208 = (void *)((long)local_170 * (long)local_1c8 + (long)local_168);
                  local_1d8 = (void *)0x0;
                  do {
                    if (-1 < (int)uVar15) {
                      local_1b8 = CONCAT44(local_1b8._4_4_,local_1a8->bias_term);
                      local_1d0 = 0;
                      local_1c0 = (ulong)(local_1a8->activation_type - 1);
                      do {
                        if (-1 < (int)local_110) {
                          local_1f0 = (float *)(local_1a8->activation_params).data;
                          local_180 = (local_1a8->bias_data).data;
                          local_188 = (long)(int)local_1d8 * (long)local_1a8->stride_d;
                          local_190 = (long)(int)local_1d0 * (long)local_1a8->stride_h;
                          local_198 = (ulong)local_1a8->stride_w;
                          uVar19 = 0;
                          do {
                            if ((int)local_1b8 == 0) {
                              fVar30 = 0.0;
                            }
                            else {
                              fVar30 = *(float *)((long)local_180 + (long)local_1c8 * 4);
                            }
                            if (0 < (int)uVar18) {
                              lVar16 = (long)local_108.w *
                                       CONCAT44(local_108.elemsize._4_4_,
                                                (undefined4)local_108.elemsize);
                              uVar23 = 0;
                              lVar24 = local_138._0_8_;
                              do {
                                if (0 < (int)uVar13) {
                                  uVar15 = 0;
                                  do {
                                    fVar30 = fVar30 + *(float *)(lVar24 + uVar15 * 4) *
                                                      *(float *)((long)local_108.data +
                                                                (long)piVar12[uVar15] * 4 +
                                                                (uVar23 + (uint)(iVar27 * iVar14)) *
                                                                local_108.cstep *
                                                                CONCAT44(local_108.elemsize._4_4_,
                                                                         (undefined4)
                                                                         local_108.elemsize) +
                                                                uVar19 * local_198 * 4 +
                                                                lVar16 * local_190 +
                                                                local_108.h * local_188 * lVar16);
                                    uVar15 = uVar15 + 1;
                                  } while (uVar13 != uVar15);
                                }
                                uVar23 = uVar23 + 1;
                                lVar24 = lVar24 + __n * 4;
                              } while (uVar23 != (uVar20 & 0xffffffff));
                            }
                            fVar31 = fVar30;
                            if ((uint)local_1c0 < 6) {
                              switch((long)&switchD_0031431c::switchdataD_0031d0c8 +
                                     (long)(int)(&switchD_0031431c::switchdataD_0031d0c8)[local_1c0]
                                    ) {
                              case 0x31431e:
                                if (fVar30 <= 0.0) {
                                  fVar31 = 0.0;
                                }
                                break;
                              case 0x314328:
                                local_b8 = ZEXT416((uint)fVar30);
                                fVar30 = expf(fVar30);
                                fVar30 = logf(fVar30 + 1.0);
                                fVar30 = tanhf(fVar30);
                                uVar18 = local_1a0 & 0xffffffff;
                                fVar31 = fVar30 * (float)local_b8._0_4_;
                                break;
                              case 0x314362:
                                if (fVar30 <= *local_1f0) {
                                  fVar30 = *local_1f0;
                                }
                                fVar31 = fVar30;
                                if (local_1f0[1] <= fVar30) {
                                  fVar31 = local_1f0[1];
                                }
                                break;
                              case 0x314378:
                                fVar30 = expf(-fVar30);
                                uVar18 = local_1a0 & 0xffffffff;
                                fVar31 = 1.0 / (fVar30 + 1.0);
                                break;
                              case 0x3143a6:
                                fVar31 = (float)(~-(uint)(0.0 < fVar30) & (uint)*local_1f0 |
                                                -(uint)(0.0 < fVar30) & 0x3f800000) * fVar30;
                                break;
                              case 0x3143d1:
                                fVar1 = *local_1f0;
                                fVar29 = -local_1f0[1] / fVar1;
                                fVar31 = 0.0;
                                if ((fVar29 <= fVar30) &&
                                   (fVar31 = fVar30, fVar30 <= fVar29 + 1.0 / fVar1)) {
                                  fVar31 = (fVar1 * fVar30 + local_1f0[1]) * fVar30;
                                }
                              }
                            }
                            *(float *)((long)local_208 + uVar19 * 4) = fVar31;
                            uVar19 = uVar19 + 1;
                          } while (uVar19 != _w);
                        }
                        local_208 = (void *)((long)local_208 + local_148 * 4);
                        iVar2 = (int)local_1d0;
                        local_1d0 = (ulong)(iVar2 + 1);
                        uVar15 = local_118;
                      } while (iVar2 != (int)local_118);
                    }
                    iVar2 = (int)local_1d8;
                    local_1d8 = (void *)(ulong)(iVar2 + 1);
                  } while (iVar2 != (int)local_1b0);
                }
                local_1e0 = local_1e0 + 1;
                local_138._0_8_ = local_138._0_8_ + local_150;
              } while (local_1e0 != local_158);
            }
            local_178 = local_178 + 1;
            local_1e8 = (ulong)(uint)((int)local_1e8 + local_140);
            uVar23 = (ulong)local_13c;
          } while (local_178 != local_98);
        }
      }
      iVar21 = 0;
    }
    if (local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  piVar9 = (int *)CONCAT44(local_108.refcount._4_4_,local_108.refcount._0_4_);
  if (piVar9 != (int *)0x0) {
    LOCK();
    *piVar9 = *piVar9 + -1;
    UNLOCK();
    if (*piVar9 == 0) {
      if (local_108.allocator == (Allocator *)0x0) {
        if (local_108.data != (void *)0x0) {
          free(local_108.data);
        }
      }
      else {
        (*(local_108.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar21;
}

Assistant:

int ConvolutionDepthWise3D::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    const int kernel_extend_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extend_h = dilation_h * (kernel_h - 1) + 1;
    const int kernel_extend_d = dilation_d * (kernel_d - 1) + 1;

    Mat bottom_blob_bordered;
    Option opt_pad = opt;
    opt_pad.use_packing_layout = false;
    make_padding(bottom_blob, bottom_blob_bordered, opt_pad);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;
    d = bottom_blob_bordered.d;

    int outw = (w - kernel_extend_w) / stride_w + 1;
    int outh = (h - kernel_extend_h) / stride_h + 1;
    int outd = (d - kernel_extend_d) / stride_d + 1;

    const int maxk = kernel_w * kernel_h * kernel_d;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap0 = w * dilation_h - kernel_w * dilation_w;
        int gap1 = h * w * dilation_d - w * kernel_h * dilation_h;
        for (int z = 0; z < kernel_d; z++)
        {
            for (int i = 0; i < kernel_h; i++)
            {
                for (int j = 0; j < kernel_w; j++)
                {
                    space_ofs[p1] = p2;
                    p1++;
                    p2 += dilation_w;
                }
                p2 += gap0;
            }
            p2 += gap1;
        }
    }

    top_blob.create(outw, outh, outd, num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // depth-wise
    if (channels == group && group == num_output)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g = 0; g < group; g++)
        {
            float* outptr = top_blob.channel(g);
            const float* kptr = (const float*)weight_data + maxk * g;
            const Mat m = bottom_blob_bordered.channel(g);

            for (int z = 0; z < outd; z++)
            {
                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        float sum = 0.f;

                        if (bias_term)
                            sum = bias_data[g];

                        const float* sptr = m.depth(z * stride_d).row(i * stride_h) + j * stride_w;

                        for (int k = 0; k < maxk; k++)
                        {
                            float val = sptr[space_ofs[k]];
                            float w = kptr[k];
                            sum += val * w;
                        }

                        outptr[j] = activation_ss(sum, activation_type, activation_params);
                    }

                    outptr += outw;
                }
            }
        }
    }
    else
    {
        // group convolution
        const int channels_g = channels / group;
        const int num_output_g = num_output / group;

#ifdef _WIN32
        #pragma omp parallel for num_threads(opt.num_threads)
#else
        #pragma omp parallel for collapse(2) num_threads(opt.num_threads)
#endif
        for (int g = 0; g < group; g++)
        {
            for (int p = 0; p < num_output_g; p++)
            {
                float* outptr = top_blob.channel(g * num_output_g + p);
                const float* weight_data_ptr = (const float*)weight_data + maxk * channels_g * num_output_g * g;

#if NCNN_SIMPLEOMP
                // shadowed variable for less openmp task args
                const int outw = top_blob.w;
                const int outh = top_blob.h;
                const int outd = top_blob.d;
#endif

                for (int z = 0; z < outd; z++)
                {
                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            float sum = 0.f;

                            if (bias_term)
                                sum = bias_data[num_output_g * g + p];

                            const float* kptr = weight_data_ptr + maxk * channels_g * p;

                            for (int q = 0; q < channels_g; q++)
                            {
                                const Mat m = bottom_blob_bordered.channel(channels_g * g + q);
                                const float* sptr = m.depth(z * stride_d).row(i * stride_h) + j * stride_w;

                                for (int l = 0; l < maxk; l++)
                                {
                                    float val = sptr[space_ofs[l]];

                                    float wt = kptr[l];
                                    sum += val * wt;
                                }

                                kptr += maxk;
                            }

                            outptr[j] = activation_ss(sum, activation_type, activation_params);
                        }

                        outptr += outw;
                    }
                }
            }
        }
    }

    return 0;
}